

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

int __thiscall
vkt::memory::anon_unknown_0::RenderVertexStorageImage::verify
          (RenderVertexStorageImage *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  TextureLevel *pTVar7;
  IVec3 *v;
  Vector<float,_4> local_100;
  PixelBufferAccess local_f0;
  Vector<float,_4> local_c8;
  PixelBufferAccess local_b8;
  PixelBufferAccess local_90;
  undefined1 local_68 [8];
  UVec4 pixel;
  undefined1 local_30 [8];
  IVec3 size;
  int pos;
  size_t param_2_local;
  VerifyRenderPassContext *context_local;
  RenderVertexStorageImage *this_local;
  
  size.m_data[1] = 0;
  unique0x100002ed = sig;
  while( true ) {
    iVar3 = size.m_data[1];
    pTVar7 = VerifyRenderPassContext::getReferenceImage((VerifyRenderPassContext *)ctx);
    iVar1 = tcu::TextureLevel::getWidth(pTVar7);
    pTVar7 = VerifyRenderPassContext::getReferenceImage((VerifyRenderPassContext *)ctx);
    iVar2 = tcu::TextureLevel::getHeight(pTVar7);
    if (SBORROW4(iVar3,iVar1 * iVar2 * 2) == iVar3 + iVar1 * iVar2 * -2 < 0) break;
    pTVar7 = VerifyRenderPassContext::getReferenceImage((VerifyRenderPassContext *)ctx);
    tcu::TextureLevel::getAccess((PixelBufferAccess *)(pixel.m_data + 2),pTVar7);
    v = tcu::ConstPixelBufferAccess::getSize((ConstPixelBufferAccess *)(pixel.m_data + 2));
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)local_30,v);
    pTVar7 = VerifyRenderPassContext::getReferenceImage((VerifyRenderPassContext *)ctx);
    tcu::TextureLevel::getAccess(&local_90,pTVar7);
    iVar3 = size.m_data[1] / 2;
    iVar1 = tcu::Vector<int,_3>::x((Vector<int,_3> *)local_30);
    iVar2 = size.m_data[1] / 2;
    iVar4 = tcu::Vector<int,_3>::x((Vector<int,_3> *)local_30);
    tcu::ConstPixelBufferAccess::getPixelUint
              ((ConstPixelBufferAccess *)local_68,(int)&local_90,iVar3 / iVar1,iVar2 % iVar4);
    if (size.m_data[1] % 2 == 0) {
      pTVar7 = VerifyRenderPassContext::getReferenceTarget((VerifyRenderPassContext *)ctx);
      tcu::TextureLevel::getAccess(&local_b8,pTVar7);
      tcu::Vector<float,_4>::Vector(&local_c8,1.0,1.0,1.0,1.0);
      uVar5 = tcu::Vector<unsigned_int,_4>::x((Vector<unsigned_int,_4> *)local_68);
      uVar6 = tcu::Vector<unsigned_int,_4>::y((Vector<unsigned_int,_4> *)local_68);
      tcu::PixelBufferAccess::setPixel(&local_b8,&local_c8,uVar5,uVar6,0);
    }
    else {
      pTVar7 = VerifyRenderPassContext::getReferenceTarget((VerifyRenderPassContext *)ctx);
      tcu::TextureLevel::getAccess(&local_f0,pTVar7);
      tcu::Vector<float,_4>::Vector(&local_100,1.0,1.0,1.0,1.0);
      uVar5 = tcu::Vector<unsigned_int,_4>::z((Vector<unsigned_int,_4> *)local_68);
      uVar6 = tcu::Vector<unsigned_int,_4>::w((Vector<unsigned_int,_4> *)local_68);
      tcu::PixelBufferAccess::setPixel(&local_f0,&local_100,uVar5,uVar6,0);
    }
    size.m_data[1] = size.m_data[1] + 1;
  }
  return iVar3;
}

Assistant:

void RenderVertexStorageImage::verify (VerifyRenderPassContext& context, size_t)
{
	for (int pos = 0; pos < (int)(context.getReferenceImage().getWidth() * context.getReferenceImage().getHeight() * 2); pos++)
	{
		const tcu::IVec3		size	= context.getReferenceImage().getAccess().getSize();
		const tcu::UVec4		pixel	= context.getReferenceImage().getAccess().getPixelUint((pos / 2) / size.x(), (pos / 2) % size.x());

		if (pos % 2 == 0)
			context.getReferenceTarget().getAccess().setPixel(Vec4(1.0f, 1.0f, 1.0f, 1.0f), pixel.x(), pixel.y());
		else
			context.getReferenceTarget().getAccess().setPixel(Vec4(1.0f, 1.0f, 1.0f, 1.0f), pixel.z(), pixel.w());
	}
}